

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O3

void __thiscall r_comp::Image::add_sys_object(Image *this,SysObject *object)

{
  iterator __position;
  long lVar1;
  uint local_14;
  
  r_code::vector<r_code::SysObject_*>::push_back(&(this->code_segment).objects,object);
  __position._M_current =
       (this->object_map).objects.m_vector.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->object_map).objects.m_vector.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->object_map,__position,
               &local_14);
  }
  else {
    *__position._M_current = (uint)this->map_offset;
    (this->object_map).objects.m_vector.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  lVar1 = r_code::SysObject::get_size();
  this->map_offset = this->map_offset + lVar1;
  return;
}

Assistant:

void Image::add_sys_object(SysObject *object)
{
    code_segment.objects.push_back(object);
    object_map.objects.push_back(map_offset);
    map_offset += object->get_size();
}